

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr.c
# Opt level: O1

Action * new_Action(Grammar *g,int akind,Term *aterm,Rule *arule,State *astate)

{
  Action **ppAVar1;
  uint uVar2;
  uint uVar3;
  Action **ppAVar4;
  Action *elem;
  anon_struct_40_4_d8687ec6_for_actions *v;
  
  elem = (Action *)malloc(0x30);
  *(undefined8 *)elem = 0;
  elem->term = (Term *)0x0;
  elem->rule = (Rule *)0x0;
  elem->state = (State *)0x0;
  *(undefined8 *)&elem->index = 0;
  elem->temp_string = (char *)0x0;
  elem->kind = akind;
  elem->term = aterm;
  elem->rule = arule;
  elem->state = astate;
  uVar2 = g->action_count;
  g->action_count = uVar2 + 1;
  elem->index = uVar2;
  ppAVar4 = (g->actions).v;
  ppAVar1 = (g->actions).e;
  if (ppAVar4 == (Action **)0x0) {
    (g->actions).v = ppAVar1;
    uVar3 = (g->actions).n;
    (g->actions).n = uVar3 + 1;
    (g->actions).e[uVar3] = elem;
    return elem;
  }
  v = &g->actions;
  uVar3 = v->n;
  if (ppAVar4 == ppAVar1) {
    if (2 < uVar3) goto LAB_0014091c;
  }
  else if ((uVar3 & 7) == 0) {
LAB_0014091c:
    vec_add_internal(v,elem);
    return elem;
  }
  v->n = uVar3 + 1;
  ppAVar4[uVar3] = elem;
  return elem;
}

Assistant:

static Action *new_Action(Grammar *g, int akind, Term *aterm, Rule *arule, State *astate) {
  Action *a = MALLOC(sizeof(Action));
  memset(a, 0, sizeof(Action));
  a->kind = akind;
  a->term = aterm;
  a->rule = arule;
  a->state = astate;
  a->index = g->action_count++;
  vec_add(&g->actions, a);
  return a;
}